

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_pack_16_mm_ay7(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar5 = m68ki_cpu.dar[0xf] - 2;
    m68ki_cpu.dar[0xf] = uVar5;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar5);
    }
    uVar1 = m68k_read_memory_8(uVar5 & m68ki_cpu.address_mask);
    uVar5 = m68ki_cpu.dar[0xf] - 2;
    m68ki_cpu.dar[0xf] = uVar5;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar5);
    }
    uVar2 = m68k_read_memory_8(uVar5 & m68ki_cpu.address_mask);
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar5);
    }
    uVar3 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
    uVar3 = uVar3 + (uVar2 | uVar1 << 8);
    uVar4 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
    uVar5 = *(int *)((long)m68ki_cpu.dar + uVar4 + 0x20) - 1;
    *(uint *)((long)m68ki_cpu.dar + uVar4 + 0x20) = uVar5;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar5 = pmmu_translate_addr(uVar5);
    }
    m68k_write_memory_8(uVar5 & m68ki_cpu.address_mask,uVar3 & 0xf | uVar3 >> 4 & 0xf0);
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_pack_16_mm_ay7(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: AX and AY are reversed in Motorola's docs */
		uint ea_src = EA_A7_PD_8();
		uint src = m68ki_read_8(ea_src);
		ea_src = EA_A7_PD_8();
		src = ((src << 8) | m68ki_read_8(ea_src)) + OPER_I_16();

		m68ki_write_8(EA_AX_PD_8(), ((src >> 4) & 0x00f0) | (src & 0x000f));
		return;
	}
	m68ki_exception_illegal();
}